

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O2

void filemgr_init(filemgr_config *config)

{
  bcache_config local_9;
  
  if (filemgr_initialized != '\0') {
    return;
  }
  pthread_spin_lock(&initial_lock);
  if (filemgr_initialized == '\0') {
    sb_ops.get_min_live_revnum = (_func_uint64_t_filemgr_ptr *)0x0;
    sb_ops.release = (_func_fdb_status_filemgr_ptr *)0x0;
    sb_ops.is_writable = (_func_bool_filemgr_ptr_bid_t *)0x0;
    sb_ops.get_bmp_revnum = (_func_uint64_t_filemgr_ptr *)0x0;
    sb_ops.read_latest = (_func_fdb_status_filemgr_ptr_sb_config_err_log_callback_ptr *)0x0;
    sb_ops.alloc_block = (_func_bid_t_filemgr_ptr *)0x0;
    sb_ops.init = (_func_fdb_status_filemgr_ptr_sb_config_err_log_callback_ptr *)0x0;
    sb_ops.get_default_config = (_func_sb_config *)0x0;
    filemgr_config::operator=(&global_config,config);
    local_9.do_not_cache_doc_blocks = global_config.do_not_cache_doc_blocks;
    if (0 < global_config.ncacheblock) {
      bcache_init(global_config.ncacheblock,global_config.blocksize,&local_9);
    }
    hash_init(&hash,0x400,_file_hash,_file_cmp);
    temp_buf = (list)ZEXT816(0);
    pthread_spin_init(&temp_buf_lock,1);
    pthread_spin_init(&filemgr_openlock,1);
    filemgr_initialized = '\x01';
  }
  pthread_spin_unlock(&initial_lock);
  return;
}

Assistant:

void filemgr_init(struct filemgr_config *config)
{
    // global initialization
    // initialized only once at first time
    if (!filemgr_initialized) {
#ifndef SPIN_INITIALIZER
        // Note that only Windows passes through this routine
        if (InterlockedCompareExchange(&initial_lock_status, 1, 0) == 0) {
            // atomically initialize spin lock only once
            spin_init(&initial_lock);
            initial_lock_status = 2;
        } else {
            // the others ... wait until initializing 'initial_lock' is done
            while (initial_lock_status != 2) {
                Sleep(1);
            }
        }
#endif

        spin_lock(&initial_lock);
        if (!filemgr_initialized) {
            memset(&sb_ops, 0x0, sizeof(sb_ops));
            global_config = *config;

            bcache_config bconfig;
            bconfig.do_not_cache_doc_blocks = global_config.do_not_cache_doc_blocks;
            if (global_config.ncacheblock > 0) {
                bcache_init(global_config.ncacheblock,
                            global_config.blocksize,
                            bconfig);
            }

            hash_init(&hash, NBUCKET, _file_hash, _file_cmp);

            // initialize temp buffer
            list_init(&temp_buf);
            spin_init(&temp_buf_lock);

            // initialize global lock
            spin_init(&filemgr_openlock);

            // set the initialize flag
            filemgr_initialized = 1;
        }
        spin_unlock(&initial_lock);
    }
}